

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O0

node_type * __thiscall
pico_tree::internal::
build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,784ul>>,pico_tree::max_leaf_size_t,pico_tree::sliding_midpoint_max_side_t,pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,float>,784ul>>
::create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>
           *this,index_type depth,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,box_type *box)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_00;
  bool bVar1;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>
  *this_00;
  difference_type dVar2;
  scalar_type *psVar3;
  node_type *pnVar4;
  undefined4 uVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RCX;
  float in_ESI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  void *in_R8;
  box_type right;
  scalar_type split_val;
  size_type split_dim;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> split;
  node_type *node;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffe6a8;
  undefined1 *i;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>
  *in_stack_ffffffffffffe6b0;
  box<float,_784UL> *this_01;
  int in_stack_ffffffffffffe6b8;
  scalar_type sVar6;
  int in_stack_ffffffffffffe6bc;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffe6c0;
  undefined4 in_stack_ffffffffffffe6c8;
  undefined4 in_stack_ffffffffffffe6cc;
  undefined1 local_1908 [128];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffe778;
  box_type *in_stack_ffffffffffffe780;
  value_type in_stack_ffffffffffffe78c;
  splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<std::vector<std::array<float,_784UL>,_std::allocator<std::array<float,_784UL>_>_>_>_>
  *in_stack_ffffffffffffe790;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffe798;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffe7a0;
  size_type *in_stack_ffffffffffffe7b0;
  scalar_type *in_stack_ffffffffffffe7b8;
  undefined1 local_74 [36];
  int *local_50;
  int *local_48;
  build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>
  *pbVar7;
  float depth_00;
  float in_stack_ffffffffffffffe0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  
  _Var8._M_current = in_RDI._M_current;
  this_00 = (build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>
             *)chunk_allocator<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>::
               allocate((chunk_allocator<pico_tree::internal::kd_tree_node_topological<int,_float>,_256UL>
                         *)in_stack_ffffffffffffe6b0);
  end_00._M_current._4_4_ = in_stack_ffffffffffffe6bc;
  end_00._M_current._0_4_ = in_stack_ffffffffffffe6b8;
  bVar1 = is_leaf<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (in_stack_ffffffffffffe6b0,
                     (index_type)((ulong)in_stack_ffffffffffffe6a8 >> 0x20),
                     in_stack_ffffffffffffe6c0,end_00);
  if (bVar1) {
    pbVar7 = this_00;
    local_48 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffe6a8);
    dVar2 = __gnu_cxx::operator-
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffe6b0,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffe6a8);
    uVar5 = (undefined4)dVar2;
    local_50 = (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffe6a8);
    __gnu_cxx::operator-
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffe6b0,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_ffffffffffffe6a8);
    kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_>::set_leaf<int>
              ((kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_> *)
               this_00,in_stack_ffffffffffffe6bc,in_stack_ffffffffffffe6b8);
    _Var8._M_current._4_4_ = uVar5;
    _Var8._M_current._0_4_ = in_stack_ffffffffffffe6c8;
    compute_bounding_box<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (this_00,in_RDI,_Var8,
               (box_type *)CONCAT44(in_stack_ffffffffffffe6bc,in_stack_ffffffffffffe6b8));
  }
  else {
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)(local_74 + 0xc)
              );
    i = local_74 + 4;
    this_01 = (box<float,_784UL> *)local_74;
    splitter_sliding_midpoint_max_side<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,784ul>>>
    ::operator()(in_stack_ffffffffffffe790,in_stack_ffffffffffffe78c,in_stack_ffffffffffffe7a0,
                 in_stack_ffffffffffffe798,in_stack_ffffffffffffe780,in_stack_ffffffffffffe778,
                 in_stack_ffffffffffffe7b0,in_stack_ffffffffffffe7b8);
    memcpy(local_1908,in_R8,0x1880);
    depth_00 = (float)((ulong)in_R8 >> 0x20);
    sVar6 = (scalar_type)local_74._0_4_;
    psVar3 = box<float,_784UL>::max(this_01,(size_type)i);
    *psVar3 = sVar6;
    psVar3 = box<float,_784UL>::min(this_01,(size_type)i);
    *psVar3 = (scalar_type)local_74._0_4_;
    pnVar4 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       ((build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>
                         *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),(index_type)depth_00,in_RCX,
                        _Var8,(box_type *)this_00);
    ((kd_tree_node_base<pico_tree::internal::kd_tree_node_topological<int,_float>_> *)
    &this_00->space_)->left = pnVar4;
    pnVar4 = create_node<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       ((build_kd_tree_impl<pico_tree::internal::space_wrapper<pico_tree::internal::matrix_space<float,_784UL>_>,_pico_tree::max_leaf_size_t,_pico_tree::sliding_midpoint_max_side_t,_pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_topological<int,_float>,_784UL>_>
                         *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),(index_type)depth_00,in_RCX,
                        _Var8,(box_type *)this_00);
    *(node_type **)&this_00->stop_value_ = pnVar4;
    kd_tree_node_topological<int,float>::set_branch<pico_tree::internal::box<float,784ul>>
              ((kd_tree_node_topological<int,_float> *)in_stack_ffffffffffffe6c0._M_current,
               (box<float,_784UL> *)CONCAT44(local_74._0_4_,sVar6),this_01,(size_t)i);
    box_base<pico_tree::internal::box<float,784ul>>::fit<pico_tree::internal::box<float,784ul>>
              ((box_base<pico_tree::internal::box<float,_784UL>_> *)in_RDI._M_current,
               (box_base<pico_tree::internal::box<float,_784UL>_> *)
               CONCAT44(in_stack_ffffffffffffe6cc,in_stack_ffffffffffffe6c8));
    pbVar7 = this_00;
  }
  return (node_type *)pbVar7;
}

Assistant:

inline node_type* create_node(
      index_type const depth,
      RandomAccessIterator_ begin,
      RandomAccessIterator_ end,
      box_type& box) const {
    node_type* node = allocator_.allocate();

    if (is_leaf(depth, begin, end)) {
      node->set_leaf(
          static_cast<index_type>(begin - indices_.begin()),
          static_cast<index_type>(end - indices_.begin()));
      // Keep the original box in case it is empty. This can only happen with
      // the midpoint split.
      if constexpr (std::is_same_v<Rule_, midpoint_max_side_t>) {
        if (begin < end) {
          compute_bounding_box(begin, end, box);
        }
      } else {
        compute_bounding_box(begin, end, box);
      }
    } else {
      // split equals end for the left branch and begin for the right branch.
      RandomAccessIterator_ split;
      size_type split_dim;
      scalar_type split_val;
      splitter_(depth, begin, end, box, split, split_dim, split_val);

      box_type right = box;
      // Argument box will function as the left bounding box until we merge
      // left and right again at the end of this code section.
      box.max(split_dim) = split_val;
      right.min(split_dim) = split_val;

      node->left = create_node(depth + 1, begin, split, box);
      node->right = create_node(depth + 1, split, end, right);

      node->set_branch(box, right, split_dim);

      // Merges both child boxes. We can expect any of the min max values to
      // change except for the ones of split_dim.
      box.fit(right);
    }

    return node;
  }